

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void __thiscall Memory::HeapInfo::Check(HeapInfo *this)

{
  HeapBucketGroup<SmallAllocationBlockAttributes> *this_00;
  HeapBucketGroup<MediumAllocationBlockAttributes> *this_01;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *in_R8;
  long lVar15;
  long lVar16;
  
  BVar3 = Recycler::CollectionInProgress(this->recycler);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x6c4,"(!this->recycler->CollectionInProgress())",
                       "!this->recycler->CollectionInProgress()");
    if (!bVar2) goto LAB_006576dc;
    *puVar4 = 0;
  }
  lVar16 = 0;
  for (lVar15 = 0x78; lVar15 != 0xa878; lVar15 = lVar15 + 0x380) {
    this_00 = (HeapBucketGroup<SmallAllocationBlockAttributes> *)
              ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
              lVar15);
    sVar5 = HeapBucketGroup<SmallAllocationBlockAttributes>::Check(this_00);
    sVar6 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetEmptyHeapBlockCount(this_00);
    lVar16 = sVar6 + sVar5 + lVar16;
  }
  for (lVar15 = 0; lVar15 != 0x6580; lVar15 = lVar15 + 0x380) {
    this_01 = (HeapBucketGroup<MediumAllocationBlockAttributes> *)
              ((long)&this->mediumHeapBuckets[0].heapBucket.
                      super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                      .
                      super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                      .super_HeapBucket.heapInfo + lVar15);
    sVar5 = HeapBucketGroup<MediumAllocationBlockAttributes>::Check(this_01);
    sVar6 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetEmptyHeapBlockCount(this_01);
    lVar16 = sVar6 + sVar5 + lVar16;
  }
  sVar5 = Check<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,SUB81(this->newLeafHeapBlockList,0),
                     (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)in_R8);
  sVar6 = Check<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,SUB81(this->newNormalHeapBlockList,0),
                     (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)in_R8);
  sVar7 = Check<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,
                     SUB81(this->newNormalWithBarrierHeapBlockList,0),
                     (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)in_R8);
  sVar8 = Check<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,
                     SUB81(this->newFinalizableWithBarrierHeapBlockList,0),
                     (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)in_R8)
  ;
  sVar9 = Check<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,SUB81(this->newFinalizableHeapBlockList,0),
                     (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)in_R8);
  sVar10 = Check<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
                     ((HeapInfo *)&DAT_00000001,false,SUB81(this->newMediumLeafHeapBlockList,0),
                      (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
                      (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)in_R8);
  sVar11 = Check<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                     ((HeapInfo *)&DAT_00000001,false,SUB81(this->newMediumNormalHeapBlockList,0),
                      (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
                      &in_R8->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>);
  sVar12 = Check<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                     ((HeapInfo *)&DAT_00000001,false,
                      SUB81(this->newMediumNormalWithBarrierHeapBlockList,0),
                      (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
                      (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)in_R8);
  sVar13 = Check<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                     ((HeapInfo *)&DAT_00000001,false,
                      SUB81(this->newMediumFinalizableWithBarrierHeapBlockList,0),
                      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
                      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                      in_R8);
  sVar14 = Check<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                     ((HeapInfo *)&DAT_00000001,false,
                      SUB81(this->newMediumFinalizableHeapBlockList,0),
                      (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0,in_R8);
  if (sVar14 + sVar13 + sVar12 + sVar11 + sVar10 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + lVar16 !=
      this->heapBlockCount[8] + this->heapBlockCount[4] +
      this->heapBlockCount[6] + this->heapBlockCount[2] +
      this->heapBlockCount[7] + this->heapBlockCount[3] +
      this->heapBlockCount[5] + this->heapBlockCount[1] + this->heapBlockCount[9] +
      this->heapBlockCount[10]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x707,"(currentSmallHeapBlockCount == expectedHeapBlockCount)",
                       "currentSmallHeapBlockCount == expectedHeapBlockCount");
    if (!bVar2) goto LAB_006576dc;
    *puVar4 = 0;
  }
  sVar5 = LargeHeapBucket::Check(&this->largeObjectBucket);
  if (sVar5 != this->heapBlockCount[0xb]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x70b,
                       "(currentLargeHeapBlockCount == this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType])"
                       ,
                       "currentLargeHeapBlockCount == this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]"
                      );
    if (!bVar2) {
LAB_006576dc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
HeapInfo::Check()
{
    Assert(!this->recycler->CollectionInProgress());

    size_t currentSmallHeapBlockCount = 0;
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        currentSmallHeapBlockCount += heapBuckets[i].Check();
        currentSmallHeapBlockCount += heapBuckets[i].GetEmptyHeapBlockCount();
    }

    size_t currentLargeHeapBlockCount = 0;
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
#if SMALLBLOCK_MEDIUM_ALLOC
        currentSmallHeapBlockCount += mediumHeapBuckets[i].Check();
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetEmptyHeapBlockCount();
#else
        currentLargeHeapBlockCount += mediumHeapBuckets[i].Check();
#endif
    }
#endif

#if ENABLE_CONCURRENT_GC
    currentSmallHeapBlockCount += Check(true, false, this->newLeafHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newNormalHeapBlockList);
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += Check(true, false, this->newNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newFinalizableWithBarrierHeapBlockList);
#endif
    currentSmallHeapBlockCount += Check(true, false, this->newFinalizableHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += Check(true, false, this->newRecyclerVisitedHostHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newMediumRecyclerVisitedHostHeapBlockList);
#endif
#endif

#if ENABLE_CONCURRENT_GC
    currentSmallHeapBlockCount += Check(true, false, this->newMediumLeafHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newMediumNormalHeapBlockList);
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += Check(true, false, this->newMediumNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newMediumFinalizableWithBarrierHeapBlockList);
#endif
    currentSmallHeapBlockCount += Check(true, false, this->newMediumFinalizableHeapBlockList);
#endif

    size_t expectedHeapBlockCount =
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockType]
#ifdef RECYCLER_VISITED_HOST
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType]
#endif
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockType];

#ifdef RECYCLER_WRITE_BARRIER
    expectedHeapBlockCount +=
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType];

#endif

    Assert(currentSmallHeapBlockCount == expectedHeapBlockCount);

    currentLargeHeapBlockCount += largeObjectBucket.Check();

    Assert(currentLargeHeapBlockCount == this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]);
}